

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdcTable.c
# Opt level: O0

void Bdc_TableAdd(Bdc_Man_t *p,Bdc_Fun_t *pFunc)

{
  Bdc_Fun_t *pFunc_local;
  Bdc_Man_t *p_local;
  
  if (p->pTable[pFunc->uSupp] == (Bdc_Fun_t *)0x0) {
    Vec_IntPush(p->vSpots,pFunc->uSupp);
  }
  pFunc->pNext = p->pTable[pFunc->uSupp];
  p->pTable[pFunc->uSupp] = pFunc;
  return;
}

Assistant:

void Bdc_TableAdd( Bdc_Man_t * p, Bdc_Fun_t * pFunc )
{
    if ( p->pTable[pFunc->uSupp] == NULL )
        Vec_IntPush( p->vSpots, pFunc->uSupp );
    pFunc->pNext = p->pTable[pFunc->uSupp];
    p->pTable[pFunc->uSupp] = pFunc;
}